

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::TriageCompareEdgeDirections<long_double>
              (Vector3<long_double> *a0,Vector3<long_double> *a1,Vector3<long_double> *b0,
              Vector3<long_double> *b1)

{
  int iVar1;
  D *b;
  longdouble in_ST0;
  longdouble lVar2;
  longdouble lVar3;
  longdouble local_e8;
  longdouble local_d8;
  longdouble local_c8;
  Vector3<long_double> nb;
  longdouble local_88;
  longdouble local_78;
  longdouble local_68;
  Vector3<long_double> na;
  
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((BasicVector<Vector3,_long_double,_3UL> *)a0,a1);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator+
            ((BasicVector<Vector3,_long_double,_3UL> *)a0,a1);
  na.c_[0]._0_10_ = nb.c_[1]._0_10_ * local_c8 - nb.c_[2]._0_10_ * local_d8;
  na.c_[1]._0_10_ = nb.c_[2]._0_10_ * local_e8 - local_c8 * nb.c_[0]._0_10_;
  na.c_[2]._0_10_ = local_d8 * nb.c_[0]._0_10_ - local_e8 * nb.c_[1]._0_10_;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((BasicVector<Vector3,_long_double,_3UL> *)b0,b1);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator+
            ((BasicVector<Vector3,_long_double,_3UL> *)b0,b1);
  nb.c_[0]._0_10_ = local_d8 * local_68 - local_c8 * local_78;
  nb.c_[1]._0_10_ = local_c8 * local_88 - local_68 * local_e8;
  nb.c_[2]._0_10_ = local_78 * local_e8 - local_88 * local_d8;
  lVar3 = in_ST0;
  lVar2 = in_ST0;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
            (na.c_,(BasicVector<Vector3,_long_double,_3UL> *)b0);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
            ((FloatType *)&nb,(BasicVector<Vector3,_long_double,_3UL> *)b0);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::DotProd
            ((longdouble *)&na,(BasicVector<Vector3,_long_double,_3UL> *)&nb,b);
  lVar3 = ((lVar3 + in_ST0) * (longdouble)6.153480596427404e-15 +
          in_ST0 * (longdouble)11.928203230275509 * lVar3) * (longdouble)5.421011e-20;
  iVar1 = 1;
  if (lVar2 <= lVar3) {
    iVar1 = -(uint)(lVar2 < -lVar3);
  }
  return iVar1;
}

Assistant:

int TriageCompareEdgeDirections(
    const Vector3<T>& a0, const Vector3<T>& a1,
    const Vector3<T>& b0, const Vector3<T>& b1) {
  constexpr T T_ERR = rounding_epsilon<T>();
  Vector3<T> na = (a0 - a1).CrossProd(a0 + a1);
  Vector3<T> nb = (b0 - b1).CrossProd(b0 + b1);
  T na_len = na.Norm(), nb_len = nb.Norm();
  T cos_ab = na.DotProd(nb);
  T cos_ab_error = ((5 + 4 * sqrt(3)) * na_len * nb_len +
                    32 * sqrt(3) * DBL_ERR * (na_len + nb_len)) * T_ERR;
  return (cos_ab > cos_ab_error) ? 1 : (cos_ab < -cos_ab_error) ? -1 : 0;
}